

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::array<MaxUsedAsInvalid,_2UL>_&,_const_std::array<MaxUsedAsInvalid,_2UL>_&>::
streamReconstructedExpression
          (BinaryExpr<const_std::array<MaxUsedAsInvalid,_2UL>_&,_const_std::array<MaxUsedAsInvalid,_2UL>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  array<MaxUsedAsInvalid,_2UL> *in_RDX;
  array<MaxUsedAsInvalid,_2UL> *range;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  rangeToString<std::array<MaxUsedAsInvalid,2ul>>(&local_40,(Catch *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  rangeToString<std::array<MaxUsedAsInvalid,2ul>>(&local_60,(Catch *)this->m_rhs,range);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }